

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlNodePtr xmlAddNextSibling(xmlNodePtr cur,xmlNodePtr elem)

{
  _xmlNode *p_Var1;
  xmlNodePtr pxVar2;
  xmlChar *pxVar3;
  
  if (cur == (xmlNodePtr)0x0) {
    pxVar2 = (xmlNodePtr)0x0;
  }
  else {
    pxVar2 = (xmlNodePtr)0x0;
    if ((elem != (xmlNodePtr)0x0) && (cur->type != XML_NAMESPACE_DECL)) {
      pxVar2 = (xmlNodePtr)0x0;
      if ((cur != elem) && (pxVar2 = (xmlNodePtr)0x0, elem->type != XML_NAMESPACE_DECL)) {
        xmlUnlinkNode(elem);
        if (elem->type == XML_ATTRIBUTE_NODE) {
          pxVar2 = xmlAddPropSibling(cur,cur,elem);
          return pxVar2;
        }
        if (elem->type == XML_TEXT_NODE) {
          if (cur->type == XML_TEXT_NODE) {
            xmlNodeAddContent(cur,elem->content);
            xmlFreeNode(elem);
            return cur;
          }
          p_Var1 = cur->next;
          if (((p_Var1 != (_xmlNode *)0x0) && (p_Var1->type == XML_TEXT_NODE)) &&
             (cur->name == p_Var1->name)) {
            pxVar3 = xmlStrdup(elem->content);
            pxVar3 = xmlStrcat(pxVar3,cur->next->content);
            xmlNodeSetContent(cur->next,pxVar3);
            (*xmlFree)(pxVar3);
            xmlFreeNode(elem);
            return cur->next;
          }
        }
        if (elem->doc != cur->doc) {
          xmlSetTreeDoc(elem,cur->doc);
        }
        p_Var1 = cur->parent;
        elem->parent = p_Var1;
        elem->prev = cur;
        elem->next = cur->next;
        cur->next = elem;
        if (elem->next != (_xmlNode *)0x0) {
          elem->next->prev = elem;
        }
        pxVar2 = elem;
        if ((p_Var1 != (_xmlNode *)0x0) && (p_Var1->last == cur)) {
          p_Var1->last = elem;
        }
      }
    }
  }
  return pxVar2;
}

Assistant:

xmlNodePtr
xmlAddNextSibling(xmlNodePtr cur, xmlNodePtr elem) {
    if ((cur == NULL) || (cur->type == XML_NAMESPACE_DECL)) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlAddNextSibling : cur == NULL\n");
#endif
	return(NULL);
    }
    if ((elem == NULL) || (elem->type == XML_NAMESPACE_DECL)) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlAddNextSibling : elem == NULL\n");
#endif
	return(NULL);
    }

    if (cur == elem) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlAddNextSibling : cur == elem\n");
#endif
	return(NULL);
    }

    xmlUnlinkNode(elem);

    if (elem->type == XML_TEXT_NODE) {
	if (cur->type == XML_TEXT_NODE) {
	    xmlNodeAddContent(cur, elem->content);
	    xmlFreeNode(elem);
	    return(cur);
	}
	if ((cur->next != NULL) && (cur->next->type == XML_TEXT_NODE) &&
            (cur->name == cur->next->name)) {
	    xmlChar *tmp;

	    tmp = xmlStrdup(elem->content);
	    tmp = xmlStrcat(tmp, cur->next->content);
	    xmlNodeSetContent(cur->next, tmp);
	    xmlFree(tmp);
	    xmlFreeNode(elem);
	    return(cur->next);
	}
    } else if (elem->type == XML_ATTRIBUTE_NODE) {
		return xmlAddPropSibling(cur, cur, elem);
    }

    if (elem->doc != cur->doc) {
	xmlSetTreeDoc(elem, cur->doc);
    }
    elem->parent = cur->parent;
    elem->prev = cur;
    elem->next = cur->next;
    cur->next = elem;
    if (elem->next != NULL)
	elem->next->prev = elem;
    if ((elem->parent != NULL) && (elem->parent->last == cur))
	elem->parent->last = elem;
    return(elem);
}